

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::~IfcElementAssembly(IfcElementAssembly *this)

{
  ~IfcElementAssembly((IfcElementAssembly *)
                      (&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x0 +
                      *(long *)(*(long *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject
                               + -0x18)));
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}